

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<capnp::compiler::Compiler::Node_*>::dispose
          (ArrayBuilder<capnp::compiler::Compiler::Node_*> *this)

{
  Node **firstElement;
  RemoveConst<capnp::compiler::Compiler::Node_*> *ppNVar1;
  Node **ppNVar2;
  Node **endCopy;
  Node **posCopy;
  Node **ptrCopy;
  ArrayBuilder<capnp::compiler::Compiler::Node_*> *this_local;
  
  firstElement = this->ptr;
  ppNVar1 = this->pos;
  ppNVar2 = this->endPtr;
  if (firstElement != (Node **)0x0) {
    this->ptr = (Node **)0x0;
    this->pos = (RemoveConst<capnp::compiler::Compiler::Node_*> *)0x0;
    this->endPtr = (Node **)0x0;
    ArrayDisposer::dispose<capnp::compiler::Compiler::Node*>
              (this->disposer,firstElement,(long)ppNVar1 - (long)firstElement >> 3,
               (long)ppNVar2 - (long)firstElement >> 3);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }